

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolLastFlag(SUNLinearSolver S,int myid)

{
  undefined8 uVar1;
  uint in_ESI;
  long in_RDI;
  double dVar2;
  double dVar3;
  sunindextype lastflag;
  double stop_time;
  double start_time;
  int local_4;
  
  if (in_RDI == 0) {
    printf(">>> FAILED test -- SUNLinSolLastFlag, Proc %d \n",(ulong)in_ESI);
    local_4 = 1;
  }
  else {
    dVar2 = get_time();
    uVar1 = SUNLinSolLastFlag(in_RDI);
    sync_device();
    dVar3 = get_time();
    if ((in_ESI == 0) &&
       (printf("    PASSED test -- SUNLinSolLastFlag (%ld) \n",uVar1), print_time != 0)) {
      printf("    SUNLinSolLastFlag Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolLastFlag(SUNLinearSolver S, int myid)
{
  double start_time, stop_time;
  sunindextype lastflag;

  /* the only way for this test to fail is if S is NULL */
  if (S == NULL)
  {
    printf(">>> FAILED test -- SUNLinSolLastFlag, Proc %d \n", myid);
    return (1);
  }

  start_time = get_time();
  lastflag   = SUNLinSolLastFlag(S);
  sync_device();
  stop_time = get_time();

  if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolLastFlag (%ld) \n", (long int)lastflag);
    PRINT_TIME("    SUNLinSolLastFlag Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}